

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.h
# Opt level: O2

bool __thiscall Allocations::Key::operator<(Key *this,Key *other)

{
  bool bVar1;
  tuple<const_long_&,_const_long_&> local_20;
  tuple<const_long_&,_const_long_&> local_10;
  
  local_10.super__Tuple_impl<0UL,_const_long_&,_const_long_&>.super__Tuple_impl<1UL,_const_long_&>.
  super__Head_base<1UL,_const_long_&,_false>._M_head_impl =
       (_Head_base<1UL,_const_long_&,_false>)&this->position;
  local_20.super__Tuple_impl<0UL,_const_long_&,_const_long_&>.super__Tuple_impl<1UL,_const_long_&>.
  super__Head_base<1UL,_const_long_&,_false>._M_head_impl =
       (_Head_base<1UL,_const_long_&,_false>)&other->position;
  local_20.super__Tuple_impl<0UL,_const_long_&,_const_long_&>.
  super__Head_base<0UL,_const_long_&,_false>._M_head_impl = &other->fileID;
  local_10.super__Tuple_impl<0UL,_const_long_&,_const_long_&>.
  super__Head_base<0UL,_const_long_&,_false>._M_head_impl = &this->fileID;
  bVar1 = std::
          __tuple_compare<std::tuple<const_long_&,_const_long_&>,_std::tuple<const_long_&,_const_long_&>,_0UL,_2UL>
          ::__less(&local_10,&local_20);
  return bVar1;
}

Assistant:

inline bool operator <(const Allocations::Key &other) const
		{
			return std::tie(fileID, position) < std::tie(other.fileID, other.position);
		}